

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_filter_ws<true>(Parser *this,substr r,size_t *i,size_t *pos)

{
  undefined1 uVar1;
  code *pcVar2;
  long lVar3;
  long lVar4;
  ro_substr chars;
  bool bVar5;
  error_flags eVar6;
  ulong *in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  long *in_R8;
  size_t j;
  size_t first;
  char msg [44];
  char curr;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  char *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  char in_stack_fffffffffffffe87;
  basic_substring<char> *in_stack_fffffffffffffe88;
  long *plVar7;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  basic_substring<char> *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  size_t in_stack_fffffffffffffea8;
  ulong local_150;
  ulong local_120;
  basic_substring<char_const> local_118 [16];
  ulong local_108;
  char *local_e0;
  undefined1 local_d8 [47];
  char local_a9;
  long *local_a8;
  ulong *local_a0;
  long local_90;
  ulong local_88;
  char *local_80;
  undefined4 local_78;
  ulong local_70;
  long *local_68;
  char *local_60;
  undefined4 local_58;
  ulong local_50;
  long *local_48;
  char *local_40;
  undefined4 local_38;
  ulong local_30;
  long *local_28;
  char *local_20;
  undefined4 local_18;
  ulong local_10;
  long *local_8;
  
  local_10 = *in_RCX;
  local_8 = &local_90;
  local_a8 = in_R8;
  local_a0 = in_RCX;
  local_90 = in_RSI;
  local_88 = in_RDX;
  if (in_RDX <= local_10) {
    eVar6 = get_error_flags();
    if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      trap_instruction();
    }
    local_20 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_18 = 0x14c3;
    handle_error(0x34dd90,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
  }
  local_a9 = *(char *)(local_90 + local_10);
  if ((local_a9 != ' ') && (local_a9 != '\t')) {
    memcpy(local_d8,"check failed: (curr == \' \' || curr == \'\\t\')",0x2c);
    eVar6 = get_error_flags();
    if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      trap_instruction();
    }
    pcVar2 = *(code **)(in_RDI + 0x9e8);
    Location::Location((Location *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                       in_stack_fffffffffffffe78,
                       CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                       CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                       CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    (*pcVar2)(local_d8,0x2c,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffe78 = local_e0;
  }
  if (*local_a0 == 0) {
    local_150 = basic_substring<char>::first_not_of
                          (in_stack_fffffffffffffe88,in_stack_fffffffffffffe87,
                           (size_t)in_stack_fffffffffffffe78);
  }
  else {
    basic_substring<char_const>::basic_substring<3ul>(local_118,(char (*) [3])" \t");
    chars.str._7_1_ = in_stack_fffffffffffffea7;
    chars.str._0_7_ = in_stack_fffffffffffffea0;
    chars.len = in_stack_fffffffffffffea8;
    local_150 = basic_substring<char>::first_not_of
                          (in_stack_fffffffffffffe98,chars,
                           CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  }
  local_108 = local_150;
  if (local_150 == 0xffffffffffffffff) {
    for (local_120 = *local_a0; local_120 < local_88; local_120 = local_120 + 1) {
      plVar7 = &local_90;
      local_70 = local_120;
      if (local_88 <= local_120) {
        local_68 = plVar7;
        eVar6 = get_error_flags();
        if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          trap_instruction();
        }
        local_80 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_78 = 0x14c3;
        handle_error(0x34dd90,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
      }
      uVar1 = *(undefined1 *)(*plVar7 + local_70);
      lVar3 = *(long *)(in_RDI + 0xa78);
      lVar4 = *local_a8;
      *local_a8 = lVar4 + 1;
      *(undefined1 *)(lVar3 + lVar4) = uVar1;
    }
    *local_a0 = local_88;
  }
  else {
    plVar7 = &local_90;
    local_30 = local_150;
    local_28 = plVar7;
    if (local_88 <= local_150) {
      eVar6 = get_error_flags();
      if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        trap_instruction();
      }
      local_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_38 = 0x14c3;
      handle_error(0x34dd90,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
    }
    if (*(char *)(*plVar7 + local_30) != '\n') {
      plVar7 = &local_90;
      local_50 = local_108;
      if (local_88 <= local_108) {
        local_48 = plVar7;
        eVar6 = get_error_flags();
        if (((eVar6 & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          trap_instruction();
        }
        local_60 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_58 = 0x14c3;
        handle_error(0x34dd90,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
      }
      if (*(char *)(*plVar7 + local_50) != '\r') {
        lVar3 = *(long *)(in_RDI + 0xa78);
        lVar4 = *local_a8;
        *local_a8 = lVar4 + 1;
        *(char *)(lVar3 + lVar4) = local_a9;
        return;
      }
    }
    *local_a0 = local_108 - 1;
  }
  return;
}

Assistant:

void Parser::_filter_ws(substr r, size_t *C4_RESTRICT i, size_t *C4_RESTRICT pos)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfws(fmt, ...) _c4dbgpf("filt_nl[{}]: " fmt, *i, __VA_ARGS__)
    #else
    #define _c4dbgfws(...)
    #endif

    const char curr = r[*i];
    _c4dbgfws("found whitespace '{}'", _c4prc(curr));
    _RYML_CB_ASSERT(m_stack.m_callbacks, curr == ' ' || curr == '\t');

    size_t first = *i > 0 ? r.first_not_of(" \t", *i) : r.first_not_of(' ', *i);
    if(first != npos)
    {
        if(r[first] == '\n' || r[first] == '\r') // skip trailing whitespace
        {
            _c4dbgfws("whitespace is trailing on line. firstnonws='{}'@{}", _c4prc(r[first]), first);
            *i = first - 1; // correct for the loop increment
        }
        else // a legit whitespace
        {
            m_filter_arena.str[(*pos)++] = curr;
            _c4dbgfws("legit whitespace. sofar=[{}]~~~{}~~~", *pos, m_filter_arena.first(*pos));
        }
    }
    else
    {
        _c4dbgfws("... everything else is trailing whitespace{}", "");
        if C4_IF_CONSTEXPR (keep_trailing_whitespace)
            for(size_t j = *i; j < r.len; ++j)
                m_filter_arena.str[(*pos)++] = r[j];
        *i = r.len;
    }

    #undef _c4dbgfws
}